

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsslsocket.cpp
# Opt level: O3

void QSslSocketPrivate::resetDefaultEllipticCurves(void)

{
  int *piVar1;
  QTlsBackend *pQVar2;
  iterator iVar3;
  iterator iVar4;
  long in_FS_OFFSET;
  QSslEllipticCurve local_6c;
  QList<QSslEllipticCurve> local_68;
  QList<int> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = tlsBackendInUse();
  if (pQVar2 != (QTlsBackend *)0x0) {
    local_48.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_48.d.d._0_4_ = 0xaaaaaaaa;
    local_48.d.d._4_4_ = 0xaaaaaaaa;
    local_48.d.ptr._0_4_ = 0xaaaaaaaa;
    local_48.d.ptr._4_4_ = 0xaaaaaaaa;
    (**(code **)(*(long *)pQVar2 + 0x100))(&local_48,pQVar2);
    if ((undefined1 *)local_48.d.size != (undefined1 *)0x0) {
      local_68.d.d = (Data *)0x0;
      local_68.d.ptr = (QSslEllipticCurve *)0x0;
      local_68.d.size = 0;
      QList<QSslEllipticCurve>::reserve(&local_68,local_48.d.size);
      iVar3 = QList<int>::begin(&local_48);
      iVar4 = QList<int>::end(&local_48);
      if (iVar3.i != iVar4.i) {
        do {
          local_6c.id = *iVar3.i;
          QtPrivate::QPodArrayOps<QSslEllipticCurve>::emplace<QSslEllipticCurve_const&>
                    ((QPodArrayOps<QSslEllipticCurve> *)&local_68,local_68.d.size,&local_6c);
          QList<QSslEllipticCurve>::end(&local_68);
          iVar3.i = iVar3.i + 1;
        } while (iVar3.i != iVar4.i);
      }
      setDefaultSupportedEllipticCurves(&local_68);
      if (&(local_68.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_68.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_68.d.d)->super_QArrayData,4,0x10);
        }
      }
    }
    piVar1 = (int *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_);
    if (piVar1 != (int *)0x0) {
      LOCK();
      *piVar1 = *piVar1 + -1;
      UNLOCK();
      if (*piVar1 == 0) {
        QArrayData::deallocate((QArrayData *)CONCAT44(local_48.d.d._4_4_,local_48.d.d._0_4_),4,0x10)
        ;
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSslSocketPrivate::resetDefaultEllipticCurves()
{
    const auto *tlsBackend = tlsBackendInUse();
    if (!tlsBackend)
        return;

    auto ids = tlsBackend->ellipticCurvesIds();
    if (!ids.size())
        return;

    QList<QSslEllipticCurve> curves;
    curves.reserve(ids.size());
    for (int id : ids) {
        QSslEllipticCurve curve;
        curve.id = id;
        curves.append(curve);
    }

    // Set the list of supported ECs, but not the list
    // of *default* ECs. OpenSSL doesn't like forcing an EC for the wrong
    // ciphersuite, so don't try it -- leave the empty list to mean
    // "the implementation will choose the most suitable one".
    setDefaultSupportedEllipticCurves(curves);
}